

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void substrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  i64 iVar4;
  char *z;
  char *pcVar5;
  u8 uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  
  if ((argv[1]->type != '\x05') && ((argc != 3 || (argv[2]->type != '\x05')))) {
    uVar6 = (*argv)->type;
    iVar4 = sqlite3VdbeIntValue(argv[1]);
    iVar3 = (int)iVar4;
    if (uVar6 == '\x04') {
      iVar1 = sqlite3ValueBytes(*argv,'\x01');
      z = (char *)sqlite3_value_blob(*argv);
      if (z != (char *)0x0) {
LAB_00174e73:
        if (argc == 3) {
          iVar4 = sqlite3VdbeIntValue(argv[2]);
          iVar2 = (int)iVar4;
          bVar12 = -1 < iVar2;
          lVar11 = -(long)iVar2;
          if (bVar12) {
            lVar11 = (long)iVar2;
          }
        }
        else {
          bVar12 = true;
          lVar11 = (long)((context->s).db)->aLimit[0];
        }
        if (iVar3 < 0) {
          lVar10 = (long)iVar3 + (long)iVar1;
          if (lVar10 < 0) {
            lVar11 = lVar11 + lVar10;
            lVar10 = 0;
            if (lVar11 < 1) {
              lVar11 = lVar10;
            }
          }
        }
        else if (iVar3 == 0) {
          lVar10 = 0;
          lVar11 = lVar11 - (ulong)(0 < lVar11);
        }
        else {
          lVar10 = (long)iVar3 + -1;
        }
        lVar8 = lVar10 - lVar11;
        lVar7 = 0;
        if (0 < lVar8) {
          lVar7 = lVar8;
        }
        lVar9 = lVar11;
        if (lVar8 < 0) {
          lVar9 = lVar10;
        }
        if (bVar12) {
          lVar9 = lVar11;
          lVar7 = lVar10;
        }
        if (uVar6 == '\x04') {
          lVar11 = iVar1 - lVar7;
          if (lVar11 < 1) {
            lVar11 = 0;
          }
          z = z + lVar7;
          if ((long)iVar1 < lVar9 + lVar7) {
            lVar9 = lVar11;
          }
          iVar3 = (int)lVar9;
          uVar6 = '\0';
        }
        else {
          if (*z != '\0') {
            while ((lVar7 != 0 && (z = z + 1, *z != '\0'))) {
              lVar7 = lVar7 + -1;
            }
          }
          pcVar5 = z;
          if (*z != '\0') {
            while ((lVar9 != 0 && (pcVar5 = pcVar5 + 1, *pcVar5 != '\0'))) {
              lVar9 = lVar9 + -1;
            }
          }
          iVar3 = (int)pcVar5 - (int)z;
          uVar6 = '\x01';
        }
        setResultStrOrError(context,z,iVar3,uVar6,(_func_void_void_ptr *)0xffffffffffffffff);
        return;
      }
    }
    else {
      z = (char *)sqlite3ValueText(*argv,'\x01');
      if (z != (char *)0x0) {
        iVar1 = 0;
        if ((iVar3 < 0) && (*z != '\0')) {
          iVar1 = 0;
          pcVar5 = z;
          do {
            pcVar5 = pcVar5 + 1;
            iVar1 = iVar1 + 1;
          } while (*pcVar5 != '\0');
        }
        goto LAB_00174e73;
      }
    }
  }
  return;
}

Assistant:

static void substrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *z;
  const unsigned char *z2;
  int len;
  int p0type;
  i64 p1, p2;
  int negP2 = 0;

  assert( argc==3 || argc==2 );
  if( sqlite3_value_type(argv[1])==SQLITE_NULL
   || (argc==3 && sqlite3_value_type(argv[2])==SQLITE_NULL)
  ){
    return;
  }
  p0type = sqlite3_value_type(argv[0]);
  p1 = sqlite3_value_int(argv[1]);
  if( p0type==SQLITE_BLOB ){
    len = sqlite3_value_bytes(argv[0]);
    z = sqlite3_value_blob(argv[0]);
    if( z==0 ) return;
    assert( len==sqlite3_value_bytes(argv[0]) );
  }else{
    z = sqlite3_value_text(argv[0]);
    if( z==0 ) return;
    len = 0;
    if( p1<0 ){
      for(z2=z; *z2; len++){
        SQLITE_SKIP_UTF8(z2);
      }
    }
  }
  if( argc==3 ){
    p2 = sqlite3_value_int(argv[2]);
    if( p2<0 ){
      p2 = -p2;
      negP2 = 1;
    }
  }else{
    p2 = sqlite3_context_db_handle(context)->aLimit[SQLITE_LIMIT_LENGTH];
  }
  if( p1<0 ){
    p1 += len;
    if( p1<0 ){
      p2 += p1;
      if( p2<0 ) p2 = 0;
      p1 = 0;
    }
  }else if( p1>0 ){
    p1--;
  }else if( p2>0 ){
    p2--;
  }
  if( negP2 ){
    p1 -= p2;
    if( p1<0 ){
      p2 += p1;
      p1 = 0;
    }
  }
  assert( p1>=0 && p2>=0 );
  if( p0type!=SQLITE_BLOB ){
    while( *z && p1 ){
      SQLITE_SKIP_UTF8(z);
      p1--;
    }
    for(z2=z; *z2 && p2; p2--){
      SQLITE_SKIP_UTF8(z2);
    }
    sqlite3_result_text(context, (char*)z, (int)(z2-z), SQLITE_TRANSIENT);
  }else{
    if( p1+p2>len ){
      p2 = len-p1;
      if( p2<0 ) p2 = 0;
    }
    sqlite3_result_blob(context, (char*)&z[p1], (int)p2, SQLITE_TRANSIENT);
  }
}